

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridges.cpp
# Opt level: O1

void estimate<std::_Bind<std::vector<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>,std::allocator<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>>>(Graph::*(std::_Placeholder<1>,unsigned_long))(bool)>>
               (Graph *g,string_view name,
               _Bind<std::vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>_(Graph::*(std::_Placeholder<1>,_unsigned_long))(bool)>
               *f,bool show)

{
  long lVar1;
  code *pcVar2;
  long lVar3;
  ostream *poVar4;
  vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_> *e;
  vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  *__range2;
  long *plVar5;
  vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  bridges;
  vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  local_48;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  pcVar2 = (code *)f->_M_f;
  plVar5 = (long *)((long)&(g->matrix).
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + *(long *)&f->field_0x8);
  if (((ulong)pcVar2 & 1) != 0) {
    pcVar2 = *(code **)(pcVar2 + *plVar5 + -1);
  }
  (*pcVar2)(&local_48,plVar5,
            (f->_M_bound_args).super__Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>.
            super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
            _M_head_impl != 0);
  lVar3 = std::chrono::_V2::system_clock::now();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,name._M_str,name._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," search found ",0xe);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," bridges and worked for ",0x18);
  poVar4 = std::ostream::_M_insert<double>((double)(lVar3 - lVar1) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," sec.",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (show) {
    for (; local_48.
           super__Vector_base<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_48.
           super__Vector_base<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        local_48.
        super__Vector_base<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_48.
             super__Vector_base<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      poVar4 = operator<<((ostream *)&std::cout,
                          local_48.
                          super__Vector_base<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
  }
  std::
  vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void estimate(Graph &g, std::string_view name, Functor f, bool show) {
    auto start = std::chrono::system_clock::now();
    auto bridges = f(&g);
    auto end = std::chrono::system_clock::now();

    std::cout << name << " search found " << bridges.size()
              << " bridges and worked for "
              << std::chrono::duration<double>(end - start).count() << " sec."
              << std::endl;

    if (show)
        for (auto &e : bridges)
            std::cout << e << std::endl;
}